

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

void xmlDumpElementOccur(xmlBufferPtr buf,xmlElementContentPtr cur)

{
  uint uVar1;
  
  uVar1 = cur->ocur - XML_ELEMENT_CONTENT_OPT;
  if (uVar1 < 3) {
    xmlBufferWriteChar(buf,&DAT_001ea264 + *(int *)(&DAT_001ea264 + (ulong)uVar1 * 4));
    return;
  }
  return;
}

Assistant:

static void
xmlDumpElementOccur(xmlBufferPtr buf, xmlElementContentPtr cur) {
    switch (cur->ocur) {
        case XML_ELEMENT_CONTENT_ONCE:
            break;
        case XML_ELEMENT_CONTENT_OPT:
            xmlBufferWriteChar(buf, "?");
            break;
        case XML_ELEMENT_CONTENT_MULT:
            xmlBufferWriteChar(buf, "*");
            break;
        case XML_ELEMENT_CONTENT_PLUS:
            xmlBufferWriteChar(buf, "+");
            break;
    }
}